

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O3

void __thiscall BPlusTree<int>::erase_node(BPlusTree<int> *this)

{
  int *piVar1;
  BPlusTree<int> **ppBVar2;
  size_t i;
  size_t index;
  
  this->next = (BPlusTree<int> *)0x0;
  this->data_size = 0;
  this->subset_size = 0;
  index = 0;
  do {
    if (index != 3) {
      piVar1 = b_array::Array<int>::operator[](&this->data,index);
      *piVar1 = 0;
    }
    ppBVar2 = b_array::Array<BPlusTree<int>_*>::operator[](&this->subset,index);
    *ppBVar2 = (BPlusTree<int> *)0x0;
    index = index + 1;
  } while (index != 4);
  return;
}

Assistant:

void BPlusTree<T>::erase_node() {
    data_size = 0;
    next = nullptr;
    subset_size = 0;
    // null out the subset array before it causes problems
    for (size_t i = 0; i < SUBSET_CAPACITY; ++i) {
        if (i < DATA_CAPACITY)
            data[i] = T();
        subset[i] = nullptr;
    }
}